

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

double __thiscall icu_63::CalendarAstronomer::getSunLongitude(CalendarAstronomer *this)

{
  UBool UVar1;
  CalendarAstronomer *this_00;
  
  this_00 = this;
  UVar1 = uprv_isNaN_63(this->sunLongitude);
  if (UVar1 != '\0') {
    UVar1 = uprv_isNaN_63(this->julianDay);
    if (UVar1 != '\0') {
      this->julianDay = (this->fTime + 210866760000000.0) / 86400000.0;
    }
    getSunLongitude(this_00,this->julianDay,&this->sunLongitude,&this->meanAnomalySun);
  }
  return this->sunLongitude;
}

Assistant:

double CalendarAstronomer::getSunLongitude()
{
    // See page 86 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.

    if (isINVALID(sunLongitude)) {
        getSunLongitude(getJulianDay(), sunLongitude, meanAnomalySun);
    }
    return sunLongitude;
}